

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meassure_recv.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  int iVar2;
  FILE *pFVar3;
  char *pcVar4;
  int local_3c;
  int i_1;
  FILE *group_B;
  int i;
  FILE *group_A;
  pthread_t r;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  r = (pthread_t)argv;
  argv_local._0_4_ = argc;
  if (argc == 4) {
    iVar2 = strcmp(argv[1],"-ff");
    if (iVar2 == 0) {
      method = 1;
      meassure = meassure_ff;
    }
    else {
      iVar2 = strcmp(*(char **)(r + 8),"-fr");
      if (iVar2 != 0) goto LAB_001012f9;
      method = 0;
      meassure = meassure_fr;
    }
    frequency = strtoll(*(char **)(r + 0x10),(char **)0x0,10);
    if (frequency != 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = frequency;
      interval = SUB168((ZEXT816(0) << 0x40 | ZEXT816(1000000000)) / auVar1,0);
      length = strtoll(*(char **)(r + 0x18),(char **)0x0,10);
      if (length != 0) {
        payload = (size_t *)malloc(length << 3);
        if (payload != (size_t *)0x0) {
          pcVar4 = "Flush+Reload";
          if (method == 1) {
            pcVar4 = "Flush+Flush";
          }
          printf("Receiving alternating \'1\' and \'0\'\n- Frequency in Hz: %zu\n- Testdata Length: %lu\n- Method: %s\n"
                 ,frequency,length,pcVar4);
          pthread_create((pthread_t *)&group_A,(pthread_attr_t *)0x0,receiver,(void *)0x0);
          pthread_join((pthread_t)group_A,(void **)0x0);
          pFVar3 = fopen("groupA.txt","w");
          for (group_B._4_4_ = 0; (ulong)(long)group_B._4_4_ < length;
              group_B._4_4_ = group_B._4_4_ + 2) {
            fprintf(pFVar3,"%lu\n",payload[group_B._4_4_]);
          }
          fclose(pFVar3);
          pFVar3 = fopen("groupB.txt","w");
          for (local_3c = 1; (ulong)(long)local_3c < length; local_3c = local_3c + 2) {
            fprintf(pFVar3,"%lu\n",payload[local_3c]);
          }
          fclose(pFVar3);
          return 0;
        }
        fprintf(_stderr,"could not allocate memory\n");
        exit(2);
      }
      length = 0;
    }
  }
LAB_001012f9:
  fprintf(_stderr,"usage: ./meassure_recv [-ff/-fr] [FREQUENCY] [TESTPOINTS]\n");
  exit(1);
}

Assistant:

int main(int argc, char* argv[])
{
    if(argc == 4)
    {
        if(strcmp(argv[1], "-ff")==0)
        {
            method = FLUSH_FLUSH;
            meassure = meassure_ff;
        }
        else
        {
            if(strcmp(argv[1], "-fr")==0)
            {
                method = FLUSH_RELOAD;
                meassure = meassure_fr;
            }
            else
            {
                goto invalid;
            }
        }

        frequency = strtoll(argv[2], NULL, 10);
        if(frequency==0) goto invalid;
        // interval in nsecs
        interval = 1000000000/frequency;

        length = strtoll(argv[3], NULL, 10);
        if(length==0) goto invalid;
    }
    else
    {
        invalid:
        fprintf(stderr, "usage: ./meassure_recv [-ff/-fr] [FREQUENCY] [TESTPOINTS]\n");
        exit(1);
    }

    payload = malloc(sizeof(size_t)*length);
    if(!payload){fprintf(stderr, "could not allocate memory\n"); exit(2);}


    printf("Receiving alternating \'1\' and \'0\'\n- Frequency in Hz: %zu\n"
           "- Testdata Length: %lu\n"
           "- Method: %s\n",
           frequency, length, method == FLUSH_FLUSH ? "Flush+Flush" : "Flush+Reload");

    pthread_t r;
    pthread_create(&r, NULL, receiver, NULL);
    pthread_join(r, NULL);

    {
        FILE* group_A = fopen("groupA.txt", "w");
        for(int i = 0; i < length; i+=2)
        {
            fprintf(group_A, "%lu\n", payload[i]);
        }

        fclose(group_A);

        FILE* group_B = fopen("groupB.txt", "w");
        for(int i = 1; i < length; i+=2)
        {
            fprintf(group_B, "%lu\n", payload[i]);
        }
        fclose(group_B);
    }

    return 0;
}